

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O2

RC __thiscall PF_HashTable::Delete(PF_HashTable *this,int fd,PageNum pageNum)

{
  PF_HashEntry *pPVar1;
  PF_HashEntry *pPVar2;
  PF_HashEntry *pPVar3;
  
  pPVar2 = (PF_HashEntry *)(this->hashTable + (pageNum + fd) % this->numBuckets);
  pPVar3 = pPVar2;
  do {
    pPVar3 = pPVar3->next;
    if (pPVar3 == (PF_HashEntry *)0x0) {
      return -8;
    }
  } while ((pPVar3->fd != fd) || (pPVar3->pageNum != pageNum));
  pPVar1 = pPVar3->next;
  if (pPVar3 == pPVar2->next) {
    pPVar2->next = pPVar1;
  }
  pPVar2 = pPVar3->prev;
  if (pPVar2 != (PF_HashEntry *)0x0) {
    pPVar2->next = pPVar1;
  }
  if (pPVar1 != (PF_HashEntry *)0x0) {
    pPVar1->prev = pPVar2;
  }
  operator_delete(pPVar3);
  return 0;
}

Assistant:

RC PF_HashTable::Delete(int fd, PageNum pageNum)
{
  // Get which bucket it should be in
  int bucket = Hash(fd, pageNum);

  // Find the entry is in this bucket
  PF_HashEntry *entry;
  for (entry = hashTable[bucket];
       entry != NULL;
       entry = entry->next) {
    if (entry->fd == fd && entry->pageNum == pageNum)
      break;
  }

  // Did we find hash entry?
  if (entry == NULL)
    return (PF_HASHNOTFOUND);

  // Remove this entry
  if (entry == hashTable[bucket])
    hashTable[bucket] = entry->next;
  if (entry->prev != NULL)
    entry->prev->next = entry->next;
  if (entry->next != NULL)
    entry->next->prev = entry->prev;
  delete entry;

  // Return ook
  return (0);
}